

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.h
# Opt level: O2

void __thiscall
Eigen::IOFormat::IOFormat
          (IOFormat *this,int _precision,int _flags,string *_coeffSeparator,string *_rowSeparator,
          string *_rowPrefix,string *_rowSuffix,string *_matPrefix,string *_matSuffix,char _fill)

{
  ulong uVar1;
  allocator local_31;
  
  std::__cxx11::string::string((string *)this,(string *)_matPrefix);
  std::__cxx11::string::string((string *)&this->matSuffix,(string *)_matSuffix);
  std::__cxx11::string::string((string *)&this->rowPrefix,(string *)_rowPrefix);
  std::__cxx11::string::string((string *)&this->rowSuffix,(string *)_rowSuffix);
  std::__cxx11::string::string((string *)&this->rowSeparator,(string *)_rowSeparator);
  std::__cxx11::string::string((string *)&this->rowSpacer,"",&local_31);
  std::__cxx11::string::string((string *)&this->coeffSeparator,(string *)_coeffSeparator);
  this->fill = _fill;
  this->precision = _precision;
  this->flags = _flags;
  if ((_flags & 1U) == 0) {
    for (uVar1 = (ulong)(uint)(this->matSuffix)._M_string_length;
        (0 < (int)uVar1 && ((this->matSuffix)._M_dataplus._M_p[uVar1 - 1] != '\n'));
        uVar1 = uVar1 - 1) {
      std::__cxx11::string::push_back((char)&this->rowSpacer);
    }
  }
  return;
}

Assistant:

IOFormat(int _precision = StreamPrecision, int _flags = 0,
    const std::string& _coeffSeparator = " ",
    const std::string& _rowSeparator = "\n", const std::string& _rowPrefix="", const std::string& _rowSuffix="",
    const std::string& _matPrefix="", const std::string& _matSuffix="", const char _fill=' ')
  : matPrefix(_matPrefix), matSuffix(_matSuffix), rowPrefix(_rowPrefix), rowSuffix(_rowSuffix), rowSeparator(_rowSeparator),
    rowSpacer(""), coeffSeparator(_coeffSeparator), fill(_fill), precision(_precision), flags(_flags)
  {
    // TODO check if rowPrefix, rowSuffix or rowSeparator contains a newline
    // don't add rowSpacer if columns are not to be aligned
    if((flags & DontAlignCols))
      return;
    int i = int(matSuffix.length())-1;
    while (i>=0 && matSuffix[i]!='\n')
    {
      rowSpacer += ' ';
      i--;
    }
  }